

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void MatchFinder_SetLimits(CMatchFinder *p)

{
  uint uVar1;
  UInt32 lenLimit;
  UInt32 limit2;
  UInt32 limit;
  CMatchFinder *p_local;
  
  limit = -p->pos - 1;
  uVar1 = p->cyclicBufferSize - p->cyclicBufferPos;
  if (uVar1 < limit) {
    limit = uVar1;
  }
  limit2 = p->streamPos - p->pos;
  if (p->keepSizeAfter < limit2) {
    limit2 = limit2 - p->keepSizeAfter;
  }
  else if (limit2 != 0) {
    limit2 = 1;
  }
  if (limit2 < limit) {
    limit = limit2;
  }
  lenLimit = p->streamPos - p->pos;
  if (p->matchMaxLen < lenLimit) {
    lenLimit = p->matchMaxLen;
  }
  p->lenLimit = lenLimit;
  p->posLimit = p->pos + limit;
  return;
}

Assistant:

static void MatchFinder_SetLimits(CMatchFinder *p)
{
  UInt32 limit = kMaxValForNormalize - p->pos;
  UInt32 limit2 = p->cyclicBufferSize - p->cyclicBufferPos;
  
  if (limit2 < limit)
    limit = limit2;
  limit2 = p->streamPos - p->pos;
  
  if (limit2 <= p->keepSizeAfter)
  {
    if (limit2 > 0)
      limit2 = 1;
  }
  else
    limit2 -= p->keepSizeAfter;
  
  if (limit2 < limit)
    limit = limit2;
  
  {
    UInt32 lenLimit = p->streamPos - p->pos;
    if (lenLimit > p->matchMaxLen)
      lenLimit = p->matchMaxLen;
    p->lenLimit = lenLimit;
  }
  p->posLimit = p->pos + limit;
}